

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O2

xmlChar * xmlEncodeSpecialChars(xmlDoc *doc,xmlChar *input)

{
  bool bVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar xVar4;
  xmlChar *pxVar5;
  size_t sVar6;
  size_t sVar7;
  
  if (input != (xmlChar *)0x0) {
    sVar6 = 1000;
    pxVar2 = (xmlChar *)(*xmlMalloc)(1000);
    pxVar5 = pxVar2;
    if (pxVar2 == (xmlChar *)0x0) {
      xmlEntitiesErrMemory("xmlEncodeSpecialChars: malloc failed");
    }
    else {
      do {
        xVar4 = *input;
        if (xVar4 == '\0') {
          *pxVar2 = '\0';
          return pxVar5;
        }
        pxVar3 = pxVar5;
        sVar7 = sVar6;
        if (sVar6 < ((long)pxVar2 - (long)pxVar5) + 10U) {
          if ((long)sVar6 < 0) break;
          sVar7 = sVar6 * 2;
          pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar5,sVar7);
          if (pxVar3 != (xmlChar *)0x0) {
            pxVar2 = pxVar3 + ((long)pxVar2 - (long)pxVar5);
            xVar4 = *input;
            goto LAB_00145542;
          }
          bVar1 = false;
        }
        else {
LAB_00145542:
          if (xVar4 == '\r') {
            builtin_memcpy(pxVar2,"&#13",4);
LAB_0014559d:
            pxVar2[4] = ';';
            pxVar2 = pxVar2 + 5;
          }
          else if (xVar4 == '\"') {
            builtin_memcpy(pxVar2,"&quot;",6);
            pxVar2 = pxVar2 + 6;
          }
          else {
            if (xVar4 == '&') {
              builtin_memcpy(pxVar2,"&amp",4);
              goto LAB_0014559d;
            }
            if (xVar4 == '>') {
              builtin_memcpy(pxVar2,"&gt;",4);
            }
            else {
              if (xVar4 != '<') {
                *pxVar2 = xVar4;
                pxVar2 = pxVar2 + 1;
                goto LAB_001455a5;
              }
              builtin_memcpy(pxVar2,"&lt;",4);
            }
            pxVar2 = pxVar2 + 4;
          }
LAB_001455a5:
          input = input + 1;
          bVar1 = true;
          pxVar5 = pxVar3;
          sVar6 = sVar7;
        }
      } while (bVar1);
      xmlEntitiesErrMemory("xmlEncodeSpecialChars: realloc failed");
      (*xmlFree)(pxVar5);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlEncodeSpecialChars(const xmlDoc *doc ATTRIBUTE_UNUSED, const xmlChar *input) {
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    size_t buffer_size = 0;
    if (input == NULL) return(NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMalloc(buffer_size * sizeof(xmlChar));
    if (buffer == NULL) {
        xmlEntitiesErrMemory("xmlEncodeSpecialChars: malloc failed");
	return(NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        size_t indx = out - buffer;
        if (indx + 10 > buffer_size) {

	    growBufferReentrant();
	    out = &buffer[indx];
	}

	/*
	 * By default one have to encode at least '<', '>', '"' and '&' !
	 */
	if (*cur == '<') {
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '>') {
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '&') {
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	} else if (*cur == '"') {
	    *out++ = '&';
	    *out++ = 'q';
	    *out++ = 'u';
	    *out++ = 'o';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '\r') {
	    *out++ = '&';
	    *out++ = '#';
	    *out++ = '1';
	    *out++ = '3';
	    *out++ = ';';
	} else {
	    /*
	     * Works because on UTF-8, all extended sequences cannot
	     * result in bytes in the ASCII range.
	     */
	    *out++ = *cur;
	}
	cur++;
    }
    *out = 0;
    return(buffer);

mem_error:
    xmlEntitiesErrMemory("xmlEncodeSpecialChars: realloc failed");
    xmlFree(buffer);
    return(NULL);
}